

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

int __thiscall Image::saveFile(Image *this,string *filename)

{
  undefined1 uVar1;
  bool bVar2;
  undefined8 in_RDI;
  string ext;
  char *in_stack_00010928;
  int in_stack_00010930;
  int in_stack_00010934;
  float *in_stack_00010938;
  char (*in_stack_ffffffffffffff78) [30];
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  char (*in_stack_ffffffffffffff88) [30];
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff9c;
  float outputgamma;
  string *filename_00;
  undefined7 in_stack_ffffffffffffffb0;
  string local_38;
  int local_4;
  
  filename_00 = &local_38;
  suffix(filename_00);
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          *in_stack_ffffffffffffff78);
  if ((bool)uVar1) {
    github111116::ConsoleLogger::warn<char[30]>
              ((ConsoleLogger *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    local_4 = -1;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                            *in_stack_ffffffffffffff78);
    outputgamma = (float)CONCAT13(bVar2,(int3)in_stack_ffffffffffffff9c);
    if (bVar2) {
      std::__cxx11::string::c_str();
      SaveEXR(in_stack_00010938,in_stack_00010934,in_stack_00010930,in_stack_00010928);
      local_4 = 0;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                              *in_stack_ffffffffffffff78);
      if (bVar2) {
        std::__cxx11::string::c_str();
        writeBMP((char *)CONCAT17(uVar1,in_stack_ffffffffffffffb0),(float *)filename_00,
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI,outputgamma);
        local_4 = 0;
      }
      else {
        github111116::ConsoleLogger::warn<char[30],std::__cxx11::string>
                  ((ConsoleLogger *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar2,in_stack_ffffffffffffff80));
        local_4 = -1;
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_38);
  return local_4;
}

Assistant:

int saveFile(const std::string& filename) const
	{
		std::string ext = suffix(filename);
		if (ext == "") {
			console.warn("saveFile: unrecognized format");
			return -1;
		}
		if (ext == "exr") {
			SaveEXR(pixels, w, h, filename.c_str());
			return 0;
		}
		if (ext == "bmp") {
			writeBMP(filename.c_str(), pixels, w, h);
			return 0;
		}
		console.warn("saveFile: unrecognized format", ext);
		return -1;
	}